

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VCompare(N_Vector X,N_Vector Z,sunindextype local_length,int myid)

{
  bool bVar1;
  long lVar2;
  uint in_ECX;
  long in_RDX;
  undefined8 in_RSI;
  N_Vector in_RDI;
  double dVar3;
  double dVar4;
  sunrealtype sVar5;
  sunindextype i;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  N_Vector in_stack_ffffffffffffffa0;
  N_Vector in_stack_ffffffffffffffa8;
  N_Vector p_Var6;
  long lVar7;
  int local_28;
  int local_4;
  
  local_28 = 0;
  bVar1 = false;
  if (in_RDX < 3) {
    printf("Error Test_N_VCompare: Local vector length is %ld, length must be >= 3\n",in_RDX);
    local_4 = 1;
  }
  else {
    for (p_Var6 = (N_Vector)0x0; (long)p_Var6 < in_RDX;
        p_Var6 = (N_Vector)((long)&p_Var6->content + 1)) {
      set_element(p_Var6,(sunindextype)in_stack_ffffffffffffffa8,
                  (sunrealtype)in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffa0 = p_Var6;
      in_stack_ffffffffffffffa8 = (N_Vector)((long)in_stack_ffffffffffffffa0 % 3);
      p_Var6 = in_stack_ffffffffffffffa0;
      if (in_stack_ffffffffffffffa8 == (N_Vector)0x0) {
        set_element(in_stack_ffffffffffffffa0,0,(sunrealtype)in_stack_ffffffffffffffa0);
      }
      else if (in_stack_ffffffffffffffa8 == (N_Vector)0x1) {
        set_element(in_stack_ffffffffffffffa0,1,(sunrealtype)in_stack_ffffffffffffffa0);
      }
      else if (in_stack_ffffffffffffffa8 == (N_Vector)0x2) {
        set_element(in_stack_ffffffffffffffa0,2,(sunrealtype)in_stack_ffffffffffffffa0);
      }
    }
    dVar3 = get_time();
    N_VCompare(0x3ff0000000000000,in_RDI,in_RSI);
    sync_device(in_RDI);
    dVar4 = get_time();
    for (lVar7 = 0; lVar7 < in_RDX; lVar7 = lVar7 + 1) {
      lVar2 = lVar7 % 3;
      if (lVar2 == 0) {
        sVar5 = get_element(in_stack_ffffffffffffffa8,(sunindextype)in_stack_ffffffffffffffa0);
        if ((sVar5 != 0.0) || (NAN(sVar5))) {
          bVar1 = true;
        }
      }
      else if (lVar2 == 1) {
        sVar5 = get_element(in_stack_ffffffffffffffa8,(sunindextype)in_stack_ffffffffffffffa0);
        if ((sVar5 != 1.0) || (NAN(sVar5))) {
          bVar1 = true;
        }
      }
      else if (lVar2 == 2) {
        sVar5 = get_element(in_stack_ffffffffffffffa8,(sunindextype)in_stack_ffffffffffffffa0);
        if ((sVar5 != 1.0) || (NAN(sVar5))) {
          bVar1 = true;
        }
      }
    }
    if (bVar1) {
      printf(">>> FAILED test -- N_VCompare, Proc %d \n",(ulong)in_ECX);
      local_28 = 1;
    }
    else if (in_ECX == 0) {
      printf("PASSED test -- N_VCompare \n");
    }
    dVar3 = max_time(in_RDI,dVar4 - dVar3);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n",dVar3,"N_VCompare");
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

int Test_N_VCompare(N_Vector X, N_Vector Z, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunindextype i;

  if (local_length < 3)
  {
    printf("Error Test_N_VCompare: Local vector length is %ld, length must be "
           ">= 3\n",
           (long int)local_length);
    return (1);
  }

  /* fill vector data */
  for (i = 0; i < local_length; i++)
  {
    set_element(Z, i, NEG_ONE);

    switch (i % 3)
    {
    case 0:
      /* abs(X[i]) < c */
      set_element(X, i, ZERO);
      break;

    case 1:
      /* abs(X[i]) = c */
      set_element(X, i, NEG_ONE);
      break;

    case 2:
      /* abs(X[i]) > c */
      set_element(X, i, NEG_TWO);
      break;
    }
  }

  start_time = get_time();
  N_VCompare(ONE, X, Z);
  sync_device(X);
  stop_time = get_time();

  /* check return vector */
  for (i = 0; i < local_length; i++)
  {
    switch (i % 3)
    {
    case 0:
      /* Z[i] == 0 */
      if (get_element(Z, i) != ZERO) { failure = 1; }
      break;

    case 1:
      /* Z[i] == 1 */
      if (get_element(Z, i) != ONE) { failure = 1; }
      break;

    case 2:
      /* Z[i] == 1 */
      if (get_element(Z, i) != ONE) { failure = 1; }
      break;
    }
  }

  if (failure)
  {
    printf(">>> FAILED test -- N_VCompare, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VCompare \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VCompare", maxt);

  return (fails);
}